

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::anon_unknown_2::addExports
          (Result<wasm::Ok> *__return_storage_ptr__,Lexer *in,Module *wasm,Named *item,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *exports,ExternalKind kind)

{
  size_t sVar1;
  char *pcVar2;
  _Variant_storage<false,wasm::Ok,wasm::Err> *p_Var3;
  Export *pEVar4;
  pointer pNVar5;
  string local_b8;
  Err local_98;
  size_t local_70;
  char *local_68;
  Name local_60;
  Named *local_50;
  Lexer *local_48;
  _Variant_storage<false,wasm::Ok,wasm::Err> *local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  pNVar5 = (exports->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_60.super_IString.str._M_str =
       (char *)(exports->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
               super__Vector_impl_data._M_finish;
  local_50 = item;
  local_48 = in;
  local_40 = (_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__;
  local_34 = kind;
  while( true ) {
    if (pNVar5 == (pointer)local_60.super_IString.str._M_str) {
      local_40[0x20] = (_Variant_storage<false,wasm::Ok,wasm::Err>)0x0;
      return (Result<wasm::Ok> *)local_40;
    }
    sVar1 = (pNVar5->super_IString).str._M_len;
    pcVar2 = (pNVar5->super_IString).str._M_str;
    pEVar4 = Module::getExportOrNull(wasm,(Name)(pNVar5->super_IString).str);
    if (pEVar4 != (Export *)0x0) break;
    local_98.msg._M_dataplus._M_p = (pointer)(local_50->name).super_IString.str._M_len;
    local_98.msg._M_string_length = (size_type)(local_50->name).super_IString.str._M_str;
    local_98.msg.field_2._M_local_buf[0] = '\0';
    local_38 = local_34;
    local_70 = sVar1;
    local_68 = pcVar2;
    std::
    make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
              (&local_60,(ExternalKind *)&local_70,
               (variant<wasm::Name,_wasm::HeapType> *)&stack0xffffffffffffffc8);
    Module::addExport(wasm,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&local_60
                     );
    std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
              ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&local_60);
    pNVar5 = pNVar5 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"repeated export name",(allocator<char> *)&local_70);
  Lexer::err(&local_98,local_48,&local_b8);
  p_Var3 = local_40;
  std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
  _Variant_storage<1ul,wasm::Err>(local_40,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return (Result<wasm::Ok> *)p_Var3;
}

Assistant:

Result<> addExports(Lexer& in,
                    Module& wasm,
                    const Named* item,
                    const std::vector<Name>& exports,
                    ExternalKind kind) {
  for (auto name : exports) {
    if (wasm.getExportOrNull(name)) {
      // TODO: Fix error location
      return in.err("repeated export name");
    }
    wasm.addExport(Builder(wasm).makeExport(name, item->name, kind));
  }
  return Ok{};
}